

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     UnaryFlatLoop<duckdb::MinMaxState<duckdb::interval_t>,duckdb::interval_t,duckdb::MinOperation>
               (interval_t *idata,AggregateInputData *aggr_input_data,
               MinMaxState<duckdb::interval_t> **states,ValidityMask *mask,idx_t count)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  unsigned_long *puVar4;
  ulong uVar5;
  MinMaxState<duckdb::interval_t> *pMVar6;
  undefined4 uVar8;
  int64_t iVar7;
  undefined4 uVar9;
  undefined4 uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  idx_t iVar14;
  int64_t *piVar15;
  ulong uVar16;
  ulong uVar17;
  interval_t input;
  interval_t input_00;
  interval_t input_01;
  int64_t *local_68;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      local_68 = &idata->micros;
      iVar14 = 0;
      do {
        pMVar6 = states[iVar14];
        uVar3 = ((interval_t *)(local_68 + -1))->months;
        uVar10 = ((interval_t *)(local_68 + -1))->days;
        iVar7 = *local_68;
        if (pMVar6->isset == false) {
          (pMVar6->value).months = uVar3;
          (pMVar6->value).days = uVar10;
          (pMVar6->value).micros = iVar7;
          pMVar6->isset = true;
        }
        else {
          input_01.micros = iVar7;
          input_01.months = uVar3;
          input_01.days = uVar10;
          MinOperation::Execute<duckdb::interval_t,duckdb::MinMaxState<duckdb::interval_t>>
                    (pMVar6,input_01,aggr_input_data);
        }
        iVar14 = iVar14 + 1;
        local_68 = local_68 + 2;
      } while (count != iVar14);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar11 = 0;
    uVar16 = 0;
    do {
      puVar4 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar4 == (unsigned_long *)0x0) {
        uVar12 = uVar16 + 0x40;
        if (count <= uVar16 + 0x40) {
          uVar12 = count;
        }
LAB_012a0d4b:
        uVar13 = uVar16;
        if (uVar16 < uVar12) {
          piVar15 = &idata[uVar16].micros;
          do {
            pMVar6 = states[uVar16];
            uVar2 = ((interval_t *)(piVar15 + -1))->months;
            uVar9 = ((interval_t *)(piVar15 + -1))->days;
            iVar7 = *piVar15;
            if (pMVar6->isset == false) {
              (pMVar6->value).months = uVar2;
              (pMVar6->value).days = uVar9;
              (pMVar6->value).micros = iVar7;
              pMVar6->isset = true;
            }
            else {
              input_00.micros = iVar7;
              input_00.months = uVar2;
              input_00.days = uVar9;
              MinOperation::Execute<duckdb::interval_t,duckdb::MinMaxState<duckdb::interval_t>>
                        (pMVar6,input_00,aggr_input_data);
            }
            uVar16 = uVar16 + 1;
            piVar15 = piVar15 + 2;
            uVar13 = uVar12;
          } while (uVar12 != uVar16);
        }
      }
      else {
        uVar5 = puVar4[uVar11];
        uVar12 = uVar16 + 0x40;
        if (count <= uVar16 + 0x40) {
          uVar12 = count;
        }
        if (uVar5 == 0xffffffffffffffff) goto LAB_012a0d4b;
        uVar13 = uVar12;
        if ((uVar5 != 0) && (uVar13 = uVar16, uVar16 < uVar12)) {
          piVar15 = &idata[uVar16].micros;
          uVar17 = 0;
          do {
            if ((uVar5 >> (uVar17 & 0x3f) & 1) != 0) {
              pMVar6 = states[uVar16 + uVar17];
              uVar1 = ((interval_t *)(piVar15 + -1))->months;
              uVar8 = ((interval_t *)(piVar15 + -1))->days;
              iVar7 = *piVar15;
              if (pMVar6->isset == false) {
                (pMVar6->value).months = uVar1;
                (pMVar6->value).days = uVar8;
                (pMVar6->value).micros = iVar7;
                pMVar6->isset = true;
              }
              else {
                input.micros = iVar7;
                input.months = uVar1;
                input.days = uVar8;
                MinOperation::Execute<duckdb::interval_t,duckdb::MinMaxState<duckdb::interval_t>>
                          (pMVar6,input,aggr_input_data);
              }
            }
            uVar17 = uVar17 + 1;
            piVar15 = piVar15 + 2;
            uVar13 = uVar12;
          } while (uVar12 - uVar16 != uVar17);
        }
      }
      uVar11 = uVar11 + 1;
      uVar16 = uVar13;
    } while (uVar11 != count + 0x3f >> 6);
  }
  return;
}

Assistant:

static inline void UnaryFlatLoop(const INPUT_TYPE *__restrict idata, AggregateInputData &aggr_input_data,
	                                 STATE_TYPE **__restrict states, ValidityMask &mask, idx_t count) {
		if (OP::IgnoreNull() && !mask.AllValid()) {
			AggregateUnaryInput input(aggr_input_data, mask);
			auto &base_idx = input.input_idx;
			base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[base_idx], idata[base_idx], input);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[base_idx], idata[base_idx],
							                                                   input);
						}
					}
				}
			}
		} else {
			AggregateUnaryInput input(aggr_input_data, mask);
			auto &i = input.input_idx;
			for (i = 0; i < count; i++) {
				OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[i], idata[i], input);
			}
		}
	}